

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall mjs::parser::parse_property_name(parser *this)

{
  element_type *peVar1;
  int iVar2;
  parser *in_RSI;
  position_stack_node _expression_position__LINE__;
  token tStack_58;
  position_stack_node local_30;
  
  local_30.stack_ = &in_RSI->expression_pos_;
  local_30.prev_ = in_RSI->expression_pos_;
  in_RSI->expression_pos_ = &local_30;
  local_30.pos_ = in_RSI->token_start_;
  if ((in_RSI->current_token_).type_ - numeric_literal < 2) {
    check_literal(in_RSI);
    get_token(&tStack_58,in_RSI);
    make_expression<mjs::literal_expression,mjs::token>(this,(token *)in_RSI);
    token::destroy(&tStack_58);
LAB_001695c1:
    position_stack_node::~position_stack_node(&local_30);
    return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
           (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
  }
  parse_identifier_name(this,(char *)in_RSI,0x19f82a);
  peVar1 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x18))();
    if (iVar2 == 0) goto LAB_001695c1;
  }
  __assert_fail("p && p->type() == expression_type::identifier",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x436,"expression_ptr mjs::parser::parse_property_name()");
}

Assistant:

expression_ptr parser::parse_property_name() {
    RECORD_EXPRESSION_START;
    if (current_token_type() == token_type::string_literal || current_token_type() == token_type::numeric_literal) {
        check_literal();
        return make_expression<literal_expression>(get_token());
    } else {
        auto p = parse_identifier_name(__func__, __LINE__);
        assert(p && p->type() == expression_type::identifier);
        return p;
    }
}